

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_rx_flow_control(lws *wsi,int _enable)

{
  int iVar1;
  lws_log_cx *plVar2;
  uint local_2c;
  int en;
  lws_context_per_thread *pt;
  int _enable_local;
  lws *wsi_local;
  
  if (((wsi->role_ops != &role_ops_h2) && ((*(ulong *)&wsi->field_0x46e >> 1 & 1) == 0)) &&
     ((wsi->wsistate & 0xf000000) != 0x1000000)) {
    plVar2 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar2,lws_log_prepend_wsi,wsi,8,"lws_rx_flow_control","0x%x",_enable);
    local_2c = _enable;
    if (((_enable & 0x4000U) == 0) && (local_2c = 0x4001, (_enable & 1U) != 0)) {
      local_2c = 0x6001;
    }
    if ((local_2c & 0x2000) == 0) {
      wsi->rxflow_bitmap = wsi->rxflow_bitmap | (byte)local_2c;
    }
    else {
      wsi->rxflow_bitmap = wsi->rxflow_bitmap & ((byte)local_2c ^ 0xff);
    }
    if (((wsi->rxflow_bitmap != '\0' ^ 0xffU) & 1 | 2) !=
        ((uint)(*(ulong *)&wsi->field_0x46e >> 0xd) & 3)) {
      *(ulong *)&wsi->field_0x46e =
           *(ulong *)&wsi->field_0x46e & 0xffffffffffff9fff |
           (ulong)((wsi->rxflow_bitmap != '\0' ^ 0xffU) & 1 | 2) << 0xd;
      plVar2 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar2,lws_log_prepend_wsi,wsi,8,"lws_rx_flow_control",
                  "bitmap 0x%x: en 0x%x, ch 0x%x",(uint)wsi->rxflow_bitmap,local_2c,
                  (uint)(*(ulong *)&wsi->field_0x46e >> 0xd) & 3);
      if (((_enable & 0x1000U) != 0) || ((*(ulong *)&wsi->field_0x46e >> 0x1f & 1) == 0)) {
        iVar1 = __lws_rx_flow_control(wsi);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

int
lws_rx_flow_control(struct lws *wsi, int _enable)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	int en = _enable;

	// h2 ignores rx flow control atm
	if (lwsi_role_h2(wsi) || wsi->mux_substream ||
	    lwsi_role_h2_ENCAPSULATION(wsi))
		return 0; // !!!

	lwsl_wsi_info(wsi, "0x%x", _enable);

	if (!(_enable & LWS_RXFLOW_REASON_APPLIES)) {
		/*
		 * convert user bool style to bitmap style... in user simple
		 * bool style _enable = 0 = flow control it, = 1 = allow rx
		 */
		en = LWS_RXFLOW_REASON_APPLIES | LWS_RXFLOW_REASON_USER_BOOL;
		if (_enable & 1)
			en |= LWS_RXFLOW_REASON_APPLIES_ENABLE_BIT;
	}

	lws_pt_lock(pt, __func__);

	/* any bit set in rxflow_bitmap DISABLEs rxflow control */
	if (en & LWS_RXFLOW_REASON_APPLIES_ENABLE_BIT)
		wsi->rxflow_bitmap = (uint8_t)(wsi->rxflow_bitmap & ~(en & 0xff));
	else
		wsi->rxflow_bitmap = (uint8_t)(wsi->rxflow_bitmap | (en & 0xff));

	if ((LWS_RXFLOW_PENDING_CHANGE | (!wsi->rxflow_bitmap)) ==
	    wsi->rxflow_change_to)
		goto skip;

	wsi->rxflow_change_to = LWS_RXFLOW_PENDING_CHANGE |
				(!wsi->rxflow_bitmap);

	lwsl_wsi_info(wsi, "bitmap 0x%x: en 0x%x, ch 0x%x",
			   wsi->rxflow_bitmap, en, wsi->rxflow_change_to);

	if (_enable & LWS_RXFLOW_REASON_FLAG_PROCESS_NOW ||
	    !wsi->rxflow_will_be_applied) {
		en = __lws_rx_flow_control(wsi);
		lws_pt_unlock(pt);

		return en;
	}

skip:
	lws_pt_unlock(pt);

	return 0;
}